

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O3

Type * __thiscall
soul::AST::TypeMetaFunction::resolveAsType(Type *__return_storage_ptr__,TypeMetaFunction *this)

{
  int iVar1;
  Type *t;
  Type type;
  Type local_28;
  
  iVar1 = (*(this->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[3])(this);
  if (((char)iVar1 == '\0') || (5 < this->operation - sourceType)) {
    throwInternalCompilerError
              ("isResolved() && operationReturnsAType (operation)","resolveAsType",0x7a6);
  }
  throwErrorIfUnresolved(this);
  getSourceType(&local_28,this);
  switch(this->operation) {
  case sourceType:
    __return_storage_ptr__->category = local_28.category;
    __return_storage_ptr__->arrayElementCategory = local_28.arrayElementCategory;
    __return_storage_ptr__->isRef = local_28.isRef;
    __return_storage_ptr__->isConstant = local_28.isConstant;
    __return_storage_ptr__->primitiveType = (PrimitiveType)local_28.primitiveType.type;
    __return_storage_ptr__->boundingSize = local_28.boundingSize;
    __return_storage_ptr__->arrayElementBoundingSize = local_28.arrayElementBoundingSize;
    (__return_storage_ptr__->structure).object = local_28.structure.object;
    local_28.structure.object = (Structure *)0x0;
    break;
  case makeConst:
    Type::createConst(__return_storage_ptr__,&local_28);
    break;
  case makeReference:
    if (local_28.isRef == true) {
      __return_storage_ptr__->category = local_28.category;
      __return_storage_ptr__->arrayElementCategory = local_28.arrayElementCategory;
      __return_storage_ptr__->isRef = true;
      __return_storage_ptr__->isConstant = local_28.isConstant;
      __return_storage_ptr__->primitiveType = (PrimitiveType)local_28.primitiveType.type;
      __return_storage_ptr__->boundingSize = local_28.boundingSize;
      __return_storage_ptr__->arrayElementBoundingSize = local_28.arrayElementBoundingSize;
      (__return_storage_ptr__->structure).object = local_28.structure.object;
      if (local_28.structure.object != (Structure *)0x0) {
        ((local_28.structure.object)->super_RefCountedObject).refCount =
             ((local_28.structure.object)->super_RefCountedObject).refCount + 1;
      }
    }
    else {
      Type::createReference(__return_storage_ptr__,&local_28);
    }
    break;
  case removeReference:
    __return_storage_ptr__->category = local_28.category;
    __return_storage_ptr__->arrayElementCategory = local_28.arrayElementCategory;
    __return_storage_ptr__->isRef = local_28.isRef;
    __return_storage_ptr__->isConstant = local_28.isConstant;
    __return_storage_ptr__->primitiveType = (PrimitiveType)local_28.primitiveType.type;
    __return_storage_ptr__->boundingSize = local_28.boundingSize;
    __return_storage_ptr__->arrayElementBoundingSize = local_28.arrayElementBoundingSize;
    (__return_storage_ptr__->structure).object = local_28.structure.object;
    if (local_28.structure.object != (Structure *)0x0) {
      ((local_28.structure.object)->super_RefCountedObject).refCount =
           ((local_28.structure.object)->super_RefCountedObject).refCount + 1;
    }
    __return_storage_ptr__->isRef = false;
    break;
  case elementType:
    Type::getElementType(__return_storage_ptr__,&local_28);
    break;
  case primitiveType:
    if ((local_28.category == structure) || (local_28.category == array)) {
      throwInternalCompilerError("! (isArray() || isStruct())","getPrimitiveType",0x1bd);
    }
    __return_storage_ptr__->category = local_28.primitiveType.type != invalid;
    __return_storage_ptr__->arrayElementCategory = invalid;
    __return_storage_ptr__->isRef = false;
    __return_storage_ptr__->isConstant = false;
    (__return_storage_ptr__->primitiveType).type = local_28.primitiveType.type;
    __return_storage_ptr__->boundingSize = 0;
    __return_storage_ptr__->arrayElementBoundingSize = 0;
    (__return_storage_ptr__->structure).object = (Structure *)0x0;
    break;
  default:
    throwInternalCompilerError("resolveAsType",0x7b2);
  }
  RefCountedPtr<soul::Structure>::decIfNotNull(local_28.structure.object);
  return __return_storage_ptr__;
}

Assistant:

Type resolveAsType() const override
        {
            SOUL_ASSERT (isResolved() && operationReturnsAType (operation));
            throwErrorIfUnresolved();

            auto type = getSourceType();

            if (operation == Op::sourceType)       return type;
            if (operation == Op::makeConst)        return type.createConst();
            if (operation == Op::makeReference)    return type.isReference() ? type : type.createReference();
            if (operation == Op::removeReference)  return type.removeReferenceIfPresent();
            if (operation == Op::elementType)      return type.getElementType();
            if (operation == Op::primitiveType)    return type.getPrimitiveType();

            SOUL_ASSERT_FALSE; return {};
        }